

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

Entry * array_new<Lib::DHMap<Kernel::TermSpec,unsigned_int,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                  (void *placement,size_t length)

{
  long in_RSI;
  Entry *in_RDI;
  Entry *p;
  Entry *res;
  undefined8 local_10;
  
  local_10 = in_RSI;
  while (local_10 != 0) {
    Lib::DHMap<Kernel::TermSpec,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::Entry::Entry
              ((Entry *)0x9649ef);
    local_10 = local_10 + -1;
  }
  return in_RDI;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}